

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

mcpl_file_t mcpl_actual_open_file(char *filename,int *repair_status)

{
  int iVar1;
  gzFile pgVar2;
  FILE *pFVar3;
  uint64_t uVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  char cVar8;
  int *in_RSI;
  char *in_RDI;
  uint64_t np;
  int64_t endpos;
  char testbuf [4];
  uint32_t i;
  uint32_t arr [8];
  uint64_t numpart;
  char *errmsg;
  int64_t current_pos;
  size_t nb;
  uchar start [8];
  char *lastdot;
  mcpl_fileinternal_t *f;
  int caller_is_mcpl_repair;
  mcpl_file_t out;
  char *in_stack_ffffffffffffff58;
  mcpl_fileinternal_t *in_stack_ffffffffffffff60;
  uint *in_stack_ffffffffffffff68;
  mcpl_fileinternal_t *in_stack_ffffffffffffff70;
  char **in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar9;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  long local_58;
  char *local_50;
  long local_48;
  ulong local_40;
  char local_38;
  char local_37;
  char local_36;
  char local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  char local_31;
  char *local_30;
  long *local_28;
  int local_1c;
  int *local_18;
  char *local_10;
  undefined8 local_8;
  
  local_1c = *in_RSI;
  *in_RSI = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI == (char *)0x0) {
    mcpl_error((char *)0x1050dd);
  }
  mcpl_platform_compatibility_check();
  local_8 = 0;
  local_28 = (long *)mcpl_internal_calloc
                               (CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_t)in_stack_ffffffffffffff78);
  *local_28 = 0;
  local_28[1] = 0;
  local_30 = strrchr(local_10,0x2e);
  if ((local_30 == (char *)0x0) || (iVar1 = strcmp(local_30,".gz"), iVar1 != 0)) {
    pFVar3 = mcpl_internal_fopen((char *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68
                                );
    *local_28 = (long)pFVar3;
    if (*local_28 == 0) {
      mcpl_internal_cleanup_file(in_stack_ffffffffffffff60);
      mcpl_error((char *)0x1051ef);
    }
  }
  else {
    pgVar2 = mcpl_gzopen((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_28[1] = (long)pgVar2;
    if (local_28[1] == 0) {
      mcpl_internal_cleanup_file(in_stack_ffffffffffffff60);
      mcpl_error((char *)0x1051a4);
    }
  }
  if (local_28[1] == 0) {
    local_40 = fread(&local_38,1,8,(FILE *)*local_28);
  }
  else {
    iVar1 = gzread(local_28[1],&local_38,8);
    local_40 = (ulong)iVar1;
  }
  if ((3 < local_40) &&
     ((((local_38 != 'M' || (local_37 != 'C')) || (local_36 != 'P')) || (local_35 != 'L')))) {
    mcpl_error((char *)0x105284);
  }
  if (local_40 != 8) {
    mcpl_error((char *)0x105298);
  }
  *(uint *)(local_28 + 3) = (local_34 - 0x30) * 100 + (local_33 - 0x30) * 10 + (local_32 - 0x30);
  if (((int)local_28[3] != 2) && ((int)local_28[3] != 3)) {
    mcpl_error((char *)0x1052ed);
  }
  iVar1 = mcpl_platform_is_little_endian();
  *(int *)(local_28 + 7) = iVar1;
  cVar8 = 'B';
  if ((int)local_28[7] != 0) {
    cVar8 = 'L';
  }
  if (local_31 != cVar8) {
    if ((local_31 == 'L') || (local_31 == 'B')) {
      mcpl_error((char *)0x105343);
    }
    else {
      mcpl_error((char *)0x105351);
    }
  }
  local_48 = 8;
  local_50 = "Errors encountered while attempting to read header";
  if (local_28[1] == 0) {
    local_40 = fread(&local_58,1,8,(FILE *)*local_28);
  }
  else {
    iVar1 = gzread(local_28[1],&local_58,8);
    local_40 = (ulong)iVar1;
  }
  if (local_40 != 8) {
    mcpl_error((char *)0x1053d1);
  }
  local_48 = local_40 + local_48;
  local_28[8] = local_58;
  if (local_28[1] == 0) {
    local_40 = fread(&local_78,1,0x20,(FILE *)*local_28);
  }
  else {
    iVar1 = gzread(local_28[1],&local_78,0x20);
    local_40 = (ulong)iVar1;
  }
  if (local_40 != 0x20) {
    mcpl_error((char *)0x10545a);
  }
  local_48 = local_40 + local_48;
  *(undefined4 *)(local_28 + 9) = local_78;
  *(undefined4 *)(local_28 + 0xb) = local_74;
  *(undefined4 *)((long)local_28 + 0x1c) = local_70;
  *(undefined4 *)(local_28 + 4) = local_6c;
  *(undefined4 *)((long)local_28 + 0x24) = in_stack_ffffffffffffff98;
  *(undefined4 *)(local_28 + 5) = in_stack_ffffffffffffff9c;
  *(undefined4 *)(local_28 + 0xf) = in_stack_ffffffffffffffa0;
  if (0x60 < *(uint *)(local_28 + 0xf)) {
    mcpl_error((char *)0x1054ec);
  }
  if (in_stack_ffffffffffffffa4 != 0) {
    if (local_28[1] == 0) {
      local_40 = fread(local_28 + 6,1,8,(FILE *)*local_28);
    }
    else {
      iVar1 = gzread(local_28[1],local_28 + 6,8);
      local_40 = (ulong)iVar1;
    }
    if (local_40 != 8) {
      mcpl_error((char *)0x10556e);
    }
    local_48 = local_40 + local_48;
  }
  *(uint *)(local_28 + 0x13) =
       *(int *)((long)local_28 + 0x24) + (int)local_28[4] * 2 + (uint)((int)local_28[5] != 0) * 4 +
       (uint)((double)local_28[6] != 0.0) * 8 + *(int *)((long)local_28 + 0x1c) * 0x10;
  uVar4 = mcpl_read_string((mcpl_fileinternal_t *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
  local_48 = uVar4 + local_48;
  if ((int)local_28[9] == 0) {
    pgVar2 = (gzFile)0x0;
  }
  else {
    pgVar2 = (gzFile)mcpl_internal_calloc
                               (CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_t)in_stack_ffffffffffffff78);
  }
  local_28[10] = (long)pgVar2;
  for (uVar9 = 0; uVar9 < *(uint *)(local_28 + 9); uVar9 = uVar9 + 1) {
    uVar4 = mcpl_read_string((mcpl_fileinternal_t *)CONCAT44(in_stack_ffffffffffffff84,uVar9),
                             in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
    local_48 = uVar4 + local_48;
  }
  local_28[0xc] = 0;
  local_28[0xd] = 0;
  local_28[0xe] = 0;
  if ((int)local_28[0xb] != 0) {
    pcVar5 = mcpl_internal_calloc
                       (CONCAT44(in_stack_ffffffffffffff84,uVar9),(size_t)in_stack_ffffffffffffff78)
    ;
    local_28[0xe] = (long)pcVar5;
    pcVar5 = mcpl_internal_calloc
                       (CONCAT44(in_stack_ffffffffffffff84,uVar9),(size_t)in_stack_ffffffffffffff78)
    ;
    local_28[0xc] = (long)pcVar5;
    pcVar5 = mcpl_internal_calloc
                       (CONCAT44(in_stack_ffffffffffffff84,uVar9),(size_t)in_stack_ffffffffffffff78)
    ;
    local_28[0xd] = (long)pcVar5;
    for (uVar9 = 0; uVar9 < *(uint *)(local_28 + 0xb); uVar9 = uVar9 + 1) {
      uVar4 = mcpl_read_string((mcpl_fileinternal_t *)CONCAT44(in_stack_ffffffffffffff84,uVar9),
                               in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
      local_48 = uVar4 + local_48;
    }
    for (uVar9 = 0; uVar9 < *(uint *)(local_28 + 0xb); uVar9 = uVar9 + 1) {
      uVar4 = mcpl_read_buffer(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(char **)pgVar2,
                               in_stack_ffffffffffffff58);
      local_48 = uVar4 + local_48;
    }
  }
  pcVar5 = mcpl_internal_calloc
                     (CONCAT44(in_stack_ffffffffffffff84,uVar9),(size_t)in_stack_ffffffffffffff78);
  local_28[0x12] = (long)pcVar5;
  local_28[0x11] = 0;
  local_28[0x10] = local_48;
  if ((local_28[8] == 0) || (local_1c != 0)) {
    if (local_28[1] == 0) {
      if ((((*local_28 != 0) && (iVar1 = fseek((FILE *)*local_28,0,2), iVar1 == 0)) &&
          (lVar6 = ftell((FILE *)*local_28), local_28[0x10] < lVar6)) &&
         ((lVar6 != local_28[0x10] &&
          (uVar7 = (ulong)(lVar6 - local_28[0x10]) / (ulong)*(uint *)(local_28 + 0xf),
          local_28[8] != uVar7)))) {
        if ((local_28[8] != 0) && ((ulong)local_28[8] < uVar7)) {
          mcpl_error((char *)0x105a6c);
        }
        if (local_1c == 0) {
          if (local_28[8] != 0) {
            mcpl_error((char *)0x105aa1);
          }
          printf("MCPL WARNING: Input file appears to not have been closed properly. Recovered %lu particles.\n"
                 ,uVar7);
        }
        else {
          *local_18 = 3;
        }
        local_28[8] = uVar7;
      }
      fseek((FILE *)*local_28,local_28[0x10],0);
    }
    else {
      if (local_28[8] == 0) {
        iVar1 = gzread(local_28[1],&stack0xffffffffffffff7c,4);
        local_40 = (ulong)iVar1;
        if (local_40 != 0) {
          if (local_1c == 0) {
            mcpl_error((char *)0x105923);
          }
          else {
            *local_18 = 1;
          }
        }
      }
      else {
        if (local_1c == 0) {
          mcpl_error((char *)0x10593d);
        }
        *local_18 = 2;
      }
      iVar1 = mcpl_gzseek(pgVar2,(int64_t)in_stack_ffffffffffffff58);
      if (iVar1 == 0) {
        mcpl_error((char *)0x10597c);
      }
    }
  }
  return (mcpl_file_t)local_28;
}

Assistant:

MCPL_LOCAL mcpl_file_t mcpl_actual_open_file(const char * filename, int * repair_status)
{
  int caller_is_mcpl_repair = *repair_status;
  *repair_status = 0;//file not broken

  if (!filename)
    mcpl_error("mcpl_open_file called with null string");

  mcpl_platform_compatibility_check();

  mcpl_file_t out;
  out.internal = NULL;

  mcpl_fileinternal_t * f
    = (mcpl_fileinternal_t*)mcpl_internal_calloc(1,sizeof(mcpl_fileinternal_t));

  //open file (with gzopen if filename ends with .gz):
  f->file = NULL;
  f->filegz = NULL;
  const char * lastdot = strrchr(filename, '.');
  if (lastdot && strcmp(lastdot, ".gz") == 0) {
    f->filegz = mcpl_gzopen( filename, "rb" );
    if (!f->filegz) {
      mcpl_internal_cleanup_file(f);
      mcpl_error("Unable to open file!");
    }
  } else {
    f->file = mcpl_internal_fopen(filename,"rb");
    if (!f->file) {
      mcpl_internal_cleanup_file(f);
      mcpl_error("Unable to open file!");
    }
  }

  //First read and check magic word, format version and endianness.
  unsigned char start[8];// = {'M','C','P','L','0','0','0','L'};
  size_t nb;
  if (f->filegz)
    nb = gzread(f->filegz, start, sizeof(start));
  else
    nb = fread(start, 1, sizeof(start), f->file);
  if (nb>=4&&(start[0]!='M'||start[1]!='C'||start[2]!='P'||start[3]!='L'))
    mcpl_error("File is not an MCPL file!");
  if (nb!=sizeof(start))
    mcpl_error("Error while reading first bytes of file!");
  f->format_version = (start[4]-'0')*100 + (start[5]-'0')*10 + (start[6]-'0');
  if (f->format_version!=2&&f->format_version!=3)
    mcpl_error("File is in an unsupported MCPL version!");
  f->is_little_endian = mcpl_platform_is_little_endian();
  if (start[7]!=(f->is_little_endian?'L':'B')) {
    if (start[7]=='L'||start[7]=='B')
      mcpl_error("Endian-ness of current platform is different than the one used to write the file.");
    else
      mcpl_error("Unexpected value in endianness field!");
  }
  int64_t current_pos = sizeof(start);

  //proceed reading header, knowing we have a consistent version and endian-ness.
  const char * errmsg = "Errors encountered while attempting to read header";

  uint64_t numpart;
  if (f->filegz)
    nb = gzread(f->filegz, &numpart, sizeof(numpart));
  else
    nb = fread(&numpart, 1, sizeof(numpart), f->file);
  if (nb!=sizeof(numpart))
    mcpl_error(errmsg);
  current_pos += nb;
  f->nparticles = numpart;

  uint32_t arr[8];
  MCPL_STATIC_ASSERT(sizeof(arr)==32);
  if (f->filegz)
    nb = gzread(f->filegz, arr, sizeof(arr));
  else
    nb=fread(arr, 1, sizeof(arr), f->file);
  if (nb!=sizeof(arr))
    mcpl_error(errmsg);
  current_pos += nb;

  f->ncomments = arr[0];
  f->nblobs = arr[1];
  f->opt_userflags = arr[2];
  f->opt_polarisation = arr[3];
  f->opt_singleprec = arr[4];
  f->opt_universalpdgcode = (int32_t)arr[5];
  f->particle_size = arr[6];//We could check consistency here with the calculated value.
  if ( ! (f->particle_size<=MCPLIMP_MAX_PARTICLE_SIZE) )
    mcpl_error("unexpected particle size");

  if (arr[7]) {
    //file has universal weight
    if (f->filegz)
      nb = gzread(f->filegz, (void*)&(f->opt_universalweight), sizeof(f->opt_universalweight));
    else
      nb=fread((void*)&(f->opt_universalweight), 1, sizeof(f->opt_universalweight), f->file);
    if (nb!=sizeof(f->opt_universalweight))
      mcpl_error(errmsg);
    current_pos += nb;
  }

  f->opt_signature = 0
    + 1 * f->opt_singleprec
    + 2 * f->opt_polarisation
    + 4 * (f->opt_universalpdgcode?1:0)
    + 8 * (f->opt_universalweight?1:0)
    + 16 * f->opt_userflags;

  //Then some strings:
  current_pos += mcpl_read_string(f,&f->hdr_srcprogname,errmsg);
  f->comments = ( f->ncomments
                  ? (char **)mcpl_internal_calloc(f->ncomments,sizeof(char*))
                  : NULL );
  uint32_t i;
  for (i = 0; i < f->ncomments; ++i)
    current_pos += mcpl_read_string(f,&(f->comments[i]),errmsg);

  f->blobkeys = NULL;
  f->bloblengths = 0;
  f->blobs = NULL;
  if (f->nblobs) {
    f->blobs = (char **)mcpl_internal_calloc(f->nblobs,sizeof(char*));
    f->blobkeys = (char **)mcpl_internal_calloc(f->nblobs,sizeof(char*));
    f->bloblengths = (uint32_t *)mcpl_internal_calloc(f->nblobs,sizeof(uint32_t));
    for (i =0; i < f->nblobs; ++i)
      current_pos += mcpl_read_string(f,&(f->blobkeys[i]),errmsg);
    for (i =0; i < f->nblobs; ++i)
      current_pos += mcpl_read_buffer(f, &(f->bloblengths[i]), &(f->blobs[i]), errmsg);
  }
  f->particle = (mcpl_particle_t*)mcpl_internal_calloc(1,sizeof(mcpl_particle_t));

  //At first event now:
  f->current_particle_idx = 0;
  f->first_particle_pos = current_pos;

  if ( f->nparticles==0 || caller_is_mcpl_repair ) {
    //TODO: Perhaps the placeholder nparticles should be UINT64_MAX instead of
    //0, so we know that nparticles=0 is a properly closed file.

    //Although empty files are permitted, it is possible that the file was never
    //closed properly (maybe the writing program ended prematurely). Let us
    //check to possibly recover usage of the file. If caller is mcpl_repair, we
    //always check since the file might have been truncated after it was first
    //closed properly.
    if (f->filegz) {
      //SEEK_END is not supported by zlib, and there is no reliable way to get
      //the input size. Thus, all we can do is to uncompress the whole thing,
      //which we won't since it might stall operations for a long time. But we
      //can at least try to check whether the file is indeed empty or not, and
      //give an error in the latter case:
      if (f->nparticles==0) {
        char testbuf[4];
        nb = gzread(f->filegz, testbuf, sizeof(testbuf));
        if (nb>0) {
          if (caller_is_mcpl_repair) {
            *repair_status = 1;//file broken but can't recover since gzip.
          } else {
            mcpl_error("Input file appears to not have been closed properly"
                       " and data recovery is disabled for gzipped files.");
          }
        }
      } else {
        if (!caller_is_mcpl_repair)
          mcpl_error("logic error (!caller_is_mcpl_repair)");
        *repair_status = 2;//file brokenness can not be determined since gzip.
      }
      if (!mcpl_gzseek( f->filegz, f->first_particle_pos ) )
        mcpl_error("Unexpected issue skipping to start of empty gzipped file");
    } else {
      //SEEK_END is not guaranteed to always work, so we fail our recovery
      //attempt silently:
      if (f->file && !MCPL_FSEEK_END( f->file )) {
        int64_t endpos = MCPL_FTELL(f->file);
        if (endpos > (int64_t)f->first_particle_pos && (uint64_t)endpos != f->first_particle_pos) {
          uint64_t np = ( endpos - f->first_particle_pos ) / f->particle_size;
          if ( f->nparticles != np ) {
            if ( f->nparticles > 0 && np > f->nparticles ) {
              //should really not happen unless file was corrupted or file was
              //first closed properly and then something was appended to it.
              mcpl_error("Input file has invalid combination of meta-data & filesize.");
            }
            if (caller_is_mcpl_repair) {
              *repair_status = 3;//file broken and should be able to repair
            } else {
              if (f->nparticles!=0)
                mcpl_error("unexpected nparticles value");
              printf("MCPL WARNING: Input file appears to not have been"
                     " closed properly. Recovered %" PRIu64 " particles.\n",np);
            }
            f->nparticles = np;
          }
        }
      }
      MCPL_FSEEK( f->file, f->first_particle_pos );//if this fseek failed, it
                                                   //might just be that we are
                                                   //at EOF with no particles.
    }
  }

  out.internal = f;
  return out;
}